

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

_Bool load(DATA_ENTRY *d,int id,char *type,char *path,char *subfolder,char *name,char *ext,int size)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *in_RCX;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  char *in_R8;
  char *in_R9;
  
  sprintf(load::spath,"%s/%s/%s.%s",in_RCX,in_R8,in_R9,name);
  printf("Loading %s...\n",load::spath);
  iVar1 = strcmp(in_RDX,"font");
  if (iVar1 == 0) {
    uVar2 = al_load_font(load::spath,(ulong)subfolder & 0xffffffff,0);
    *(undefined8 *)(in_RDI + (long)in_ESI * 0x40 + 0x38) = uVar2;
  }
  iVar1 = strcmp(in_RDX,"bitmap");
  if (iVar1 == 0) {
    uVar2 = al_load_bitmap(load::spath);
    *(undefined8 *)(in_RDI + (long)in_ESI * 0x40 + 0x38) = uVar2;
  }
  iVar1 = strcmp(in_RDX,"sample");
  if (iVar1 == 0) {
    uVar2 = al_load_sample(load::spath);
    *(undefined8 *)(in_RDI + (long)in_ESI * 0x40 + 0x38) = uVar2;
  }
  iVar1 = strcmp(in_RDX,"music");
  if (iVar1 == 0) {
    uVar2 = al_load_audio_stream(load::spath,2,0x1000);
    *(undefined8 *)(in_RDI + (long)in_ESI * 0x40 + 0x38) = uVar2;
  }
  if (*(long *)(in_RDI + (long)in_ESI * 0x40 + 0x38) == 0) {
    printf("Failed loading %s.\n",in_R9);
  }
  *(char **)(in_RDI + (long)in_ESI * 0x40 + 8) = in_RDX;
  pcVar3 = strdup(in_RCX);
  *(char **)(in_RDI + (long)in_ESI * 0x40 + 0x10) = pcVar3;
  pcVar3 = strdup(in_R8);
  *(char **)(in_RDI + (long)in_ESI * 0x40 + 0x18) = pcVar3;
  pcVar3 = strdup(in_R9);
  *(char **)(in_RDI + (long)in_ESI * 0x40 + 0x20) = pcVar3;
  pcVar3 = strdup(name);
  *(char **)(in_RDI + (long)in_ESI * 0x40 + 0x28) = pcVar3;
  *(undefined4 *)(in_RDI + (long)in_ESI * 0x40 + 0x30) = subfolder._0_4_;
  return *(long *)(in_RDI + (long)in_ESI * 0x40 + 0x38) != 0;
}

Assistant:

static bool load(DATA_ENTRY *d, int id, char const *type, char const *path,
   char const *subfolder, char const *name, char const *ext, int size)
{
   static char spath[1024];
   sprintf(spath, "%s/%s/%s.%s", path, subfolder, name, ext);
   printf("Loading %s...\n", spath);
   if (!strcmp(type, "font")) d[id].dat = al_load_font(spath, size, 0);
   if (!strcmp(type, "bitmap")) d[id].dat = al_load_bitmap(spath);
   if (!strcmp(type, "sample")) d[id].dat = al_load_sample(spath);
   if (!strcmp(type, "music")) d[id].dat = al_load_audio_stream(spath, 2, 4096);
   if (d[id].dat == NULL) {
      printf("Failed loading %s.\n", name);
   }
   d[id].type = type;
   d[id].path = strdup(path);
   d[id].subfolder = strdup(subfolder);
   d[id].name = strdup(name);
   d[id].ext = strdup(ext);
   d[id].size = size;
   return d[id].dat != NULL;
}